

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

bool __thiscall
ot::commissioner::CommissionerApp::OnJoinerFinalize
          (CommissionerApp *this,ByteArray *aJoinerId,string *aVendorName,string *aVendorModel,
          string *aVendorSwVersion,ByteArray *aVendorStackVersion,string *aProvisioningUrl,
          ByteArray *aVendorData)

{
  __type_conflict1 _Var1;
  JoinerInfo *pJVar2;
  JoinerInfo *configuredJoinerInfo;
  bool accepted;
  ByteArray *aVendorStackVersion_local;
  string *aVendorSwVersion_local;
  string *aVendorModel_local;
  string *aVendorName_local;
  ByteArray *aJoinerId_local;
  CommissionerApp *this_local;
  
  pJVar2 = GetJoinerInfo(this,kMeshCoP,aJoinerId);
  if (pJVar2 == (JoinerInfo *)0x0) {
    configuredJoinerInfo._7_1_ = false;
  }
  else {
    _Var1 = std::operator==(aProvisioningUrl,&pJVar2->mProvisioningUrl);
    if (_Var1) {
      configuredJoinerInfo._7_1_ = true;
    }
    else {
      configuredJoinerInfo._7_1_ = false;
    }
  }
  return configuredJoinerInfo._7_1_;
}

Assistant:

bool CommissionerApp::OnJoinerFinalize(const ByteArray   &aJoinerId,
                                       const std::string &aVendorName,
                                       const std::string &aVendorModel,
                                       const std::string &aVendorSwVersion,
                                       const ByteArray   &aVendorStackVersion,
                                       const std::string &aProvisioningUrl,
                                       const ByteArray   &aVendorData)
{
    (void)aVendorName;
    (void)aVendorModel;
    (void)aVendorSwVersion;
    (void)aVendorStackVersion;
    (void)aVendorData;

    bool accepted = false;

    auto configuredJoinerInfo = GetJoinerInfo(JoinerType::kMeshCoP, aJoinerId);

    // TODO(deimi): logging
    VerifyOrExit(configuredJoinerInfo != nullptr, accepted = false);
    VerifyOrExit(aProvisioningUrl == configuredJoinerInfo->mProvisioningUrl, accepted = false);

    accepted = true;

exit:
    return accepted;
}